

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ctl.c
# Opt level: O1

void env_tilde_dsp(t_sigenv *x,t_signal **sp)

{
  int iVar1;
  int iVar2;
  int iVar3;
  t_sample *ptVar4;
  
  iVar1 = (*sp)->s_n;
  iVar2 = x->x_period;
  iVar3 = (iVar1 + iVar2) - iVar2 % iVar1;
  if (iVar2 % iVar1 == 0) {
    iVar3 = iVar2;
  }
  x->x_realperiod = iVar3;
  if (x->x_allocforvs < iVar1) {
    ptVar4 = (t_sample *)
             resizebytes(x->x_buf,(long)(x->x_allocforvs + x->x_npoints) << 2,
                         (long)(iVar1 + x->x_npoints) << 2);
    if (ptVar4 == (t_sample *)0x0) {
      pd_error((void *)0x0,"env~: out of memory");
      return;
    }
    x->x_buf = ptVar4;
    x->x_allocforvs = (*sp)->s_n;
  }
  dsp_add(env_tilde_perform,3,x,(*sp)->s_vec,(long)(*sp)->s_n);
  return;
}

Assistant:

static void env_tilde_dsp(t_sigenv *x, t_signal **sp)
{
    if (x->x_period % sp[0]->s_n) x->x_realperiod =
        x->x_period + sp[0]->s_n - (x->x_period % sp[0]->s_n);
    else x->x_realperiod = x->x_period;
    if (sp[0]->s_n > x->x_allocforvs)
    {
        void *xx = resizebytes(x->x_buf,
            (x->x_npoints + x->x_allocforvs) * sizeof(t_sample),
            (x->x_npoints + sp[0]->s_n) * sizeof(t_sample));
        if (!xx)
        {
            pd_error(0, "env~: out of memory");
            return;
        }
        x->x_buf = (t_sample *)xx;
        x->x_allocforvs = sp[0]->s_n;
    }
    dsp_add(env_tilde_perform, 3, x, sp[0]->s_vec, (t_int)sp[0]->s_n);
}